

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hh
# Opt level: O3

void __thiscall avro::StreamWriter::writeBytes(StreamWriter *this,uint8_t *b,size_t n)

{
  uint8_t *__dest;
  uint8_t *puVar1;
  ulong __n;
  
  if (n != 0) {
    __dest = this->next_;
    do {
      puVar1 = this->end_;
      if (__dest == puVar1) {
        more(this);
        __dest = this->next_;
        puVar1 = this->end_;
      }
      __n = (long)puVar1 - (long)__dest;
      if (n <= (ulong)((long)puVar1 - (long)__dest)) {
        __n = n;
      }
      memcpy(__dest,b,__n);
      __dest = this->next_ + __n;
      this->next_ = __dest;
      b = b + __n;
      n = n - __n;
    } while (n != 0);
  }
  return;
}

Assistant:

void writeBytes(const uint8_t* b, size_t n) {
        while (n > 0) {
            if (next_ == end_) {
                more();
            }
            size_t q = end_ - next_;
            if (q > n) {
                q = n;
            }
            ::memcpy(next_, b, q);
            next_ += q;
            b += q;
            n -= q;
        }
    }